

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# te.hpp
# Opt level: O0

void __thiscall
te::v1::static_vtable<Drawable>::static_vtable(static_vtable<Drawable> *this,size_t size)

{
  int iVar1;
  pointer ppvVar2;
  size_t size_local;
  static_vtable<Drawable> *this_local;
  
  this->vtable_ = (ptr_t *)0x0;
  if (static_vtable(unsigned_long)::vtable == '\0') {
    iVar1 = __cxa_guard_acquire(&static_vtable(unsigned_long)::vtable);
    if (iVar1 != 0) {
      std::make_unique<void*[]>(0x106098);
      __cxa_atexit(std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr,
                   &static_vtable::vtable,&__dso_handle);
      __cxa_guard_release(&static_vtable(unsigned_long)::vtable);
    }
  }
  ppvVar2 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::get(&static_vtable::vtable);
  this->vtable_ = ppvVar2;
  return;
}

Assistant:

explicit static_vtable(const std::size_t size) {
    static auto vtable = std::make_unique<ptr_t[]>(size);
    vtable_ = vtable.get();
  }